

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSocket.cpp
# Opt level: O0

void __thiscall
ServerSocketUDP::ServerSocketUDP(ServerSocketUDP *this,int domain,int type,int protocol,int port)

{
  int iVar1;
  ostream *this_00;
  int port_local;
  int protocol_local;
  int type_local;
  int domain_local;
  ServerSocketUDP *this_local;
  
  this->portNumber = port;
  this->serverSocketFD = -1;
  socketServer(this,domain,type,protocol);
  iVar1 = bindServer(this);
  if (0 < iVar1) {
    this_00 = std::operator<<((ostream *)&std::cout,"Binding successfully done....");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

ServerSocketUDP::ServerSocketUDP(int domain, int type, int protocol, int port) {
    this->portNumber = port;
    this->serverSocketFD = -1;  //FD: file descriptor 文件描述符
    this->socketServer(domain, type, protocol);
    if (this->bindServer() > 0) {
        cout << "Binding successfully done...." << endl;
    }
}